

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceBase.hpp
# Opt level: O0

void __thiscall
Diligent::FenceBase<Diligent::EngineGLImplTraits>::DvpSignal
          (FenceBase<Diligent::EngineGLImplTraits> *this,Uint64 NewValue)

{
  unsigned_long *__a;
  unsigned_long uVar1;
  atomic<unsigned_long> *paVar2;
  Char *Message;
  unsigned_long *puVar3;
  undefined8 uVar4;
  char (*in_stack_fffffffffffffde8) [71];
  undefined1 local_a8 [8];
  string msg;
  Uint64 EnqueuedValue;
  Uint64 NewValue_local;
  FenceBase<Diligent::EngineGLImplTraits> *this_local;
  memory_order local_68;
  int local_64;
  memory_order __b;
  char local_54 [4];
  unsigned_long local_50;
  unsigned_long *local_48;
  atomic<unsigned_long> *local_40;
  bool local_31;
  unsigned_long local_30;
  memory_order local_28;
  undefined4 local_24;
  unsigned_long local_20;
  unsigned_long *local_18;
  atomic<unsigned_long> *local_10;
  
  paVar2 = &this->m_EnqueuedFenceValue;
  local_64 = 5;
  EnqueuedValue = NewValue;
  NewValue_local = (Uint64)this;
  ___b = paVar2;
  local_68 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_64 - 1U < 2) {
    this_local = (FenceBase<Diligent::EngineGLImplTraits> *)
                 (paVar2->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_64 == 5) {
    this_local = (FenceBase<Diligent::EngineGLImplTraits> *)
                 (paVar2->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    this_local = (FenceBase<Diligent::EngineGLImplTraits> *)
                 (paVar2->super___atomic_base<unsigned_long>)._M_i;
  }
  msg.field_2._8_8_ = this_local;
  if (EnqueuedValue < this_local) {
    FormatString<char[8],char_const*,char[55],unsigned_long,char[27],unsigned_long,char[71]>
              ((string *)local_a8,(Diligent *)0x460d87,
               (char (*) [8])
               &(this->
                super_DeviceObjectBase<Diligent::IFenceGL,_Diligent::RenderDeviceGLImpl,_Diligent::FenceDesc>
                ).m_Desc,(char **)"\' is being signaled or enqueued for signal with value ",
               (char (*) [55])&EnqueuedValue,(unsigned_long *)", but the previous value (",
               (char (*) [27])((long)&msg.field_2 + 8),
               (unsigned_long *)
               ") is greater than the new value. Signal operation will have no effect.",
               in_stack_fffffffffffffde8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"DvpSignal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FenceBase.hpp"
               ,0x51);
    std::__cxx11::string::~string((string *)local_a8);
  }
  do {
    paVar2 = &this->m_EnqueuedFenceValue;
    __a = (unsigned_long *)(msg.field_2._M_local_buf + 8);
    puVar3 = std::max<unsigned_long>(__a,&EnqueuedValue);
    uVar1 = *puVar3;
    local_54[0] = '\x05';
    local_54[1] = '\0';
    local_54[2] = '\0';
    local_54[3] = '\0';
    local_50 = uVar1;
    local_48 = __a;
    local_40 = paVar2;
    local_28 = std::__cmpexch_failure_order(memory_order_seq_cst);
    local_24 = 5;
    switch(0x16f1ba) {
    default:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
      else {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
      break;
    case 2:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
      else {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
      break;
    case 3:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
      else {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
      break;
    case 4:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
      else {
        LOCK();
        uVar4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        local_31 = msg.field_2._8_8_ == uVar4;
        if (local_31) {
          (paVar2->super___atomic_base<unsigned_long>)._M_i = uVar1;
          uVar4 = msg.field_2._8_8_;
        }
        UNLOCK();
        if (!local_31) {
          msg.field_2._8_8_ = uVar4;
        }
      }
    }
    local_30 = uVar1;
    local_20 = uVar1;
    local_18 = __a;
    local_10 = paVar2;
  } while (((local_31 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void DvpSignal(Uint64 NewValue)
    {
#ifdef DILIGENT_DEVELOPMENT
        Uint64 EnqueuedValue = m_EnqueuedFenceValue.load();
        DEV_CHECK_ERR(NewValue >= EnqueuedValue,
                      "Fence '", this->m_Desc.Name, "' is being signaled or enqueued for signal with value ", NewValue,
                      ", but the previous value (", EnqueuedValue,
                      ") is greater than the new value. Signal operation will have no effect.");

        while (!m_EnqueuedFenceValue.compare_exchange_weak(EnqueuedValue, std::max(EnqueuedValue, NewValue)))
        {
            // If exchange fails, EnqueuedValue will hold the actual value of m_EnqueuedFenceValue.
        }
#endif
    }